

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.hpp
# Opt level: O0

void __thiscall nite::FileTransfer::FTSession::FTSession(FTSession *this)

{
  uint64_t uVar1;
  anon_class_1_0_00000001 local_1d [13];
  FTSession *local_10;
  FTSession *this_local;
  
  local_10 = this;
  IP_Port::IP_Port(&this->ip);
  IndexedFile::IndexedFile(&this->indexed);
  std::function<void_(const_nite::IndexedFile_&,_bool)>::function(&this->callback);
  std::__cxx11::string::string((string *)&this->id);
  this->index = 0;
  this->file = (FILE *)0x0;
  uVar1 = getTicks();
  this->lastResend = uVar1;
  std::function<void(nite::IndexedFile_const&,bool)>::operator=
            ((function<void(nite::IndexedFile_const&,bool)> *)&this->callback,local_1d);
  ping(this);
  return;
}

Assistant:

FTSession(){
					index = 0;
					file = NULL;
					lastResend = nite::getTicks();
					callback = [](const nite::IndexedFile &file, bool success){
						
					};
					ping();
				}